

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O2

string * __thiscall
cmJSONState::GetJsonContext_abi_cxx11_
          (string *__return_storage_ptr__,cmJSONState *this,Location loc)

{
  int iVar1;
  ulong uVar2;
  char local_1fa [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string line;
  stringstream sstream;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&sstream,(string *)&this->doc,_S_out|_S_in);
  uVar2 = 0;
  if (0 < loc.line) {
    uVar2 = (ulong)loc & 0xffffffff;
  }
  while (iVar1 = (int)uVar2, uVar2 = (ulong)(iVar1 - 1), iVar1 != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&sstream,(string *)&line,'\n');
  }
  local_1fa[0] = '\n';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_1f8,(char)((ulong)((long)loc + -0x100000000) >> 0x20));
  local_1fa[1] = 0x5e;
  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string,char>
            (__return_storage_ptr__,&line,local_1fa,&local_1f8,local_1fa + 1);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

std::string cmJSONState::GetJsonContext(Location loc)
{
  std::string line;
  std::stringstream sstream(doc);
  for (int i = 0; i < loc.line; ++i) {
    std::getline(sstream, line, '\n');
  }
  return cmStrCat(line, '\n', std::string(loc.column - 1, ' '), '^');
}